

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

int Scl_LibertyReadDeriveStrength(Scl_Tree_t *p,Scl_Item_t *pCell)

{
  int iVar1;
  Scl_Item_t *pSVar2;
  char *__nptr;
  int *piVar3;
  
  piVar3 = &pCell->Child;
  while( true ) {
    pSVar2 = Scl_LibertyItem(p,*piVar3);
    if (pSVar2 == (Scl_Item_t *)0x0) {
      return 0;
    }
    iVar1 = Scl_LibertyCompare(p,pSVar2->Key,"drive_strength");
    if (iVar1 == 0) break;
    piVar3 = &pSVar2->Next;
  }
  __nptr = Scl_LibertyReadString(p,pSVar2->Head);
  iVar1 = atoi(__nptr);
  return iVar1;
}

Assistant:

int Scl_LibertyReadDeriveStrength( Scl_Tree_t * p, Scl_Item_t * pCell )
{
    Scl_Item_t * pItem;
    Scl_ItemForEachChildName( p, pCell, pItem, "drive_strength" )
        return atoi(Scl_LibertyReadString(p, pItem->Head));
    return 0;
}